

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O3

int __thiscall PixelToaster::UnixDisplay::open(UnixDisplay *this,char *__file,int __oflag,...)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Listener *pLVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  Display *pDVar13;
  Converter *pCVar14;
  Converter *pCVar15;
  Window WVar16;
  Atom AVar17;
  XImage *pXVar18;
  undefined4 extraout_var;
  int in_ECX;
  long lVar19;
  Enumeration in_R8D;
  Enumeration in_R9D;
  Format destination;
  bool bVar20;
  XSizeHints sizeHints;
  XSetWindowAttributes attributes;
  
  (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])();
  uVar12 = 0;
  do {
    if (__file[uVar12] == '\0') goto LAB_00109320;
    (this->super_DisplayAdapter)._title[uVar12] = __file[uVar12];
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xff);
  uVar12 = 0xff;
LAB_00109320:
  (this->super_DisplayAdapter)._title[uVar12 & 0xffffffff] = '\0';
  (this->super_DisplayAdapter)._width = __oflag;
  (this->super_DisplayAdapter)._height = in_ECX;
  (this->super_DisplayAdapter)._output.enumeration = in_R8D;
  (this->super_DisplayAdapter)._mode.enumeration = in_R9D;
  (this->super_DisplayAdapter)._open = true;
  pDVar13 = (Display *)XOpenDisplay(0);
  this->display_ = pDVar13;
  if (pDVar13 == (Display *)0x0) goto LAB_001097be;
  lVar2 = *(long *)(pDVar13 + 0xe8);
  lVar19 = (long)*(int *)(pDVar13 + 0xe0) * 0x80;
  lVar3 = *(long *)(lVar2 + 0x40 + lVar19);
  if (lVar3 == 0) goto LAB_001097be;
  lVar1 = lVar2 + lVar19;
  uVar11 = *(uint *)(lVar1 + 0x38);
  uVar12 = 0x20;
  if (uVar11 != 0x18) {
    uVar12 = (ulong)uVar11;
  }
  uVar7 = (uint)uVar12;
  uVar8 = uVar7 + 0xe;
  if (-1 < (int)(uVar7 + 7)) {
    uVar8 = uVar7 + 7;
  }
  if ((0x20 < uVar7) || ((0x1fe01fe00U >> (uVar12 & 0x3f) & 1) == 0)) goto LAB_001097be;
  lVar4 = *(long *)(lVar3 + 0x18);
  lVar5 = *(long *)(lVar3 + 0x20);
  uVar12 = *(ulong *)(lVar3 + 0x28);
  if (uVar7 == 0x20) {
    if (((lVar5 != 0xff00) || (lVar4 != 0xff0000)) ||
       (destination.enumeration = XRGB8888, uVar12 != 0xff)) {
      if ((lVar5 == 0xff00) && (lVar4 == 0xff)) {
        destination.enumeration = XBGR8888;
LAB_00109513:
        if (uVar12 == 0xff0000) goto LAB_0010951e;
      }
      goto LAB_0010951b;
    }
  }
  else {
    if (uVar7 == 0x18) {
      if (((lVar5 == 0xff00) && (lVar4 == 0xff0000)) &&
         (destination.enumeration = RGB888, uVar12 == 0xff)) goto LAB_0010951e;
      if ((lVar5 == 0xff00) && (lVar4 == 0xff)) {
        destination.enumeration = BGR888;
        goto LAB_00109513;
      }
    }
    else if (uVar7 == 0x10) {
      destination.enumeration = XRGB1555;
      if ((((lVar5 == 0x3e0 && lVar4 == 0x7c00) && (uVar12 ^ 0x1f) == 0) ||
          ((((lVar4 == 0x1f && (lVar5 == 0x3e0)) &&
            (destination.enumeration = XBGR1555, uVar12 == 0x7c00)) ||
           (destination.enumeration = RGB565,
           (lVar5 == 0x7e0 && lVar4 == 0xf800) && (uVar12 ^ 0x1f) == 0)))) ||
         (((lVar4 == 0x1f && (lVar5 == 0x7e0)) &&
          (destination.enumeration = BGR565, uVar12 == 0xf800)))) goto LAB_0010951e;
    }
LAB_0010951b:
    destination.enumeration = Unknown;
  }
LAB_0010951e:
  (this->destFormat_).enumeration = destination.enumeration;
  pCVar14 = requestConverter((Format)0x9,destination);
  this->floatingPointConverter_ = pCVar14;
  pCVar15 = requestConverter((Format)0x1,destination);
  this->trueColorConverter_ = pCVar15;
  if (pCVar14 != (Converter *)0x0 && pCVar15 != (Converter *)0x0) {
    attributes.background_pixel = *(unsigned_long *)(lVar2 + 0x60 + lVar19);
    attributes.backing_store = 0;
    attributes.border_pixel = attributes.background_pixel;
    WVar16 = XCreateWindow(pDVar13,*(undefined8 *)(lVar2 + 0x10 + lVar19),
                           (*(int *)(lVar1 + 0x18) - __oflag) / 2,
                           (*(int *)(lVar1 + 0x1c) - in_ECX) / 2,__oflag,in_ECX,0,uVar11,1,lVar3,
                           0x4a,&attributes);
    this->window_ = WVar16;
    XStoreName(this->display_,WVar16,__file);
    AVar17 = XInternAtom(this->display_,"WM_PROTOCOLS",1);
    this->wmProtocols_ = AVar17;
    AVar17 = XInternAtom(this->display_,"WM_DELETE_WINDOW",1);
    this->wmDeleteWindow_ = AVar17;
    if ((AVar17 != 0 && this->wmProtocols_ != 0) &&
       (iVar9 = XSetWMProtocols(this->display_,this->window_,&this->wmDeleteWindow_,1), iVar9 != 0))
    {
      XSetNormalHints(this->display_,this->window_);
      XClearWindow(this->display_,this->window_);
      XSelectInput(this->display_,this->window_,0x204f);
      DirtyVector<char>::reset(&this->buffer_,(long)(in_ECX * __oflag * ((int)uVar8 >> 3)));
      bVar20 = (this->buffer_).data_ == (char *)0x0;
      iVar9 = (int)CONCAT71((int7)((ulong)pDVar13 >> 8),!bVar20);
      if (bVar20) {
        (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])(this);
        return iVar9;
      }
      this->gc_ = *(GC *)(*(long *)(this->display_ + 0xe8) + 0x48 + lVar19);
      pXVar18 = (XImage *)
                XCreateImage(this->display_,0,uVar11,2,0,0,__oflag,in_ECX,uVar8 & 0xfffffff8,
                             ((int)uVar8 >> 3) * __oflag);
      this->image_ = pXVar18;
      pXVar18->byte_order = 0;
      XMapRaised(this->display_,this->window_);
      XFlush(this->display_);
      pLVar6 = (this->super_DisplayAdapter)._listener;
      if (pLVar6 == (Listener *)0x0) {
        return iVar9;
      }
      iVar10 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                         (this);
      if (CONCAT44(extraout_var,iVar10) != 0) {
        uVar11 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                           (this);
        this = (UnixDisplay *)(ulong)uVar11;
      }
      (**(code **)(*(long *)pLVar6 + 0x50))(pLVar6,this);
      return iVar9;
    }
  }
LAB_001097be:
  (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])(this);
  return 0;
}

Assistant:

bool open(const char title[], int width, int height, Output output, Mode mode) override
    {
        DisplayAdapter::open(title, width, height, output, mode);

        // let's open a display

        display_ = ::XOpenDisplay(0);
        if (!display_)
        {
            close();
            return false;
        }

        const int screen = DefaultScreen(display_);
        ::Visual* visual = DefaultVisual(display_, screen);
        if (!visual)
        {
            close();
            return false;
        }

        // It gets messy when talking about color depths.
        //
        // For the image buffer, we either need 8, 16 or 32 bitsPerPixel.  8 bits we'll
        // never have (hopefully), 16 bits will be used for displayDepth 15 & 16, and
        // 32 bits must be used for depths 24 and 32.
        //
        // The converters will get this right when talking about displayDepth 15 & 16, but
        // it will wrongly assume that displayDepth 24 takes _exactly_ 24 bitsPerPixel.  We
        // solve that by tricking the converter requester by presenting it a 32 bit
        // bufferDepth instead.
        //
        const int displayDepth  = DefaultDepth(display_, screen);
        const int bufferDepth   = displayDepth == 24 ? 32 : displayDepth;
        const int bytesPerPixel = (bufferDepth + 7) / 8;
        const int bitsPerPixel  = 8 * bytesPerPixel;
        if (bitsPerPixel != 16 && bitsPerPixel != 32)
        {
            close();
            return false;
        }

        destFormat_             = findFormat(bufferDepth,
                                 visual->red_mask, visual->green_mask, visual->blue_mask);
        floatingPointConverter_ = requestConverter(Format::XBGRFFFF, destFormat_);
        trueColorConverter_     = requestConverter(Format::XRGB8888, destFormat_);
        if (!floatingPointConverter_ || !trueColorConverter_)
        {
            close();
            return false;
        }

        // let's create a window

        const Window root = DefaultRootWindow(display_);

        const int screenWidth  = DisplayWidth(display_, screen);
        const int screenHeight = DisplayHeight(display_, screen);
        const int left         = (screenWidth - width) / 2;
        const int top          = (screenHeight - height) / 2;

        ::XSetWindowAttributes attributes;
        attributes.border_pixel = attributes.background_pixel = BlackPixel(display_, screen);
        attributes.backing_store                              = NotUseful;

        window_ = ::XCreateWindow(display_, root, left, top, width, height, 0,
                                  displayDepth, InputOutput, visual,
                                  CWBackPixel | CWBorderPixel | CWBackingStore, &attributes);

        ::XStoreName(display_, window_, title);

        wmProtocols_    = XInternAtom(display_, "WM_PROTOCOLS", True);
        wmDeleteWindow_ = XInternAtom(display_, "WM_DELETE_WINDOW", True);
        if (wmProtocols_ == 0 || wmDeleteWindow_ == 0)
        {
            close();
            return false;
        }
        if (::XSetWMProtocols(display_, window_, &wmDeleteWindow_, 1) == 0)
        {
            close();
            return false;
        }

        ::XSizeHints sizeHints;
        sizeHints.flags = PPosition | PMinSize | PMaxSize;
        sizeHints.x = sizeHints.y = 0;
        sizeHints.min_width = sizeHints.max_width = width;
        sizeHints.min_height = sizeHints.max_height = height;
        ::XSetNormalHints(display_, window_, &sizeHints);
        ::XClearWindow(display_, window_);
        ::XSelectInput(display_, window_, eventMask_);

        // create (image) buffer

        buffer_.reset(width * height * bytesPerPixel);
        if (buffer_.isEmpty())
        {
            close();
            return false;
        }

        gc_    = DefaultGC(display_, screen);
        image_ = ::XCreateImage(display_, CopyFromParent, displayDepth, ZPixmap, 0, 0,
                                width, height, bitsPerPixel, width * bytesPerPixel);
#if defined(PIXELTOASTER_LITTLE_ENDIAN)
        image_->byte_order = LSBFirst;
#else
        image_->byte_order = MSBFirst;
#endif
        if (!image_)
        {
            close();
            return false;
        }

        // we have a winner!

        ::XMapRaised(display_, window_);
        ::XFlush(display_);

        if (DisplayAdapter::listener())
            DisplayAdapter::listener()->onOpen(wrapper() ? *wrapper() : *(DisplayInterface*)this);

        return true;
    }